

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_hdwallet.cpp
# Opt level: O2

void __thiscall cfd::core::HDWallet::HDWallet(HDWallet *this,ByteData *seed)

{
  size_t sVar1;
  CfdException *this_00;
  allocator local_41;
  string local_40;
  
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this,&seed->data_);
  sVar1 = ByteData::GetDataSize(seed);
  if (sVar1 != 0x10) {
    sVar1 = ByteData::GetDataSize(seed);
    if (sVar1 != 0x20) {
      sVar1 = ByteData::GetDataSize(seed);
      if (sVar1 != 0x40) {
        this_00 = (CfdException *)__cxa_allocate_exception(0x30);
        ::std::__cxx11::string::string((string *)&local_40,"Seed length error.",&local_41);
        CfdException::CfdException(this_00,kCfdIllegalArgumentError,&local_40);
        __cxa_throw(this_00,&CfdException::typeinfo,CfdException::~CfdException);
      }
    }
  }
  return;
}

Assistant:

HDWallet::HDWallet(const ByteData& seed) : seed_(seed) {
  if ((seed.GetDataSize() != HDWallet::kSeed128Size) &&
      (seed.GetDataSize() != HDWallet::kSeed256Size) &&
      (seed.GetDataSize() != HDWallet::kSeed512Size)) {
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Seed length error.");
  }
}